

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

Emb_Obj_t * Emb_ManFindDistances(Emb_Man_t *p,Vec_Int_t *vStart,Emb_Dat_t *pDist)

{
  int *piVar1;
  uint uVar2;
  Vec_Int_t *vThis;
  Vec_Int_t *vNext;
  Emb_Obj_t *pEVar3;
  int i;
  
  p->nReached = 0;
  p->nDistMax = 0;
  vThis = Vec_IntAlloc(1000);
  vNext = Vec_IntAlloc(1000);
  p->nTravIds = p->nTravIds + 1;
  for (i = 0; i < vStart->nSize; i = i + 1) {
    uVar2 = Vec_IntEntry(vStart,i);
    piVar1 = p->pObjData;
    if (piVar1 == (int *)0x0) break;
    piVar1[(ulong)uVar2 + 3] = p->nTravIds;
    Vec_IntPush(vThis,piVar1[(ulong)uVar2 + 2]);
  }
  pEVar3 = Emb_ManPerformBfs(p,vThis,vNext,pDist);
  Vec_IntFree(vThis);
  Vec_IntFree(vNext);
  return pEVar3;
}

Assistant:

Emb_Obj_t * Emb_ManFindDistances( Emb_Man_t * p, Vec_Int_t * vStart, Emb_Dat_t * pDist )
{
    Vec_Int_t * vThis, * vNext;
    Emb_Obj_t * pThis, * pResult;
    int i;
    p->nReached = p->nDistMax = 0;
    vThis = Vec_IntAlloc( 1000 );
    vNext = Vec_IntAlloc( 1000 );
    Emb_ManIncrementTravId( p );
    Emb_ManForEachObjVec( vStart, p, pThis, i )
    {
        Emb_ObjSetTravIdCurrent( p, pThis );
        Vec_IntPush( vThis, pThis->hHandle );
    }
    pResult = Emb_ManPerformBfs( p, vThis, vNext, pDist );
    Vec_IntFree( vThis );
    Vec_IntFree( vNext );
    return pResult;
}